

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void store_update(void)

{
  town_conflict *ptVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint n;
  town *town_1;
  wchar_t m;
  town *town;
  store *s;
  wchar_t i;
  
  if (((player->opts).opt[0x1a] & 1U) != 0) {
    msg("Updating Shops...");
  }
  while (daycount != 0) {
    daycount = daycount - 1;
    for (s._4_4_ = 0; s._4_4_ < world->num_towns; s._4_4_ = s._4_4_ + 1) {
      for (town = (town *)world->towns[s._4_4_].stores; town != (town *)0x0; town = *(town **)town)
      {
        _Var2 = store_is_home((store *)town);
        if (!_Var2) {
          store_maint((store *)town);
        }
      }
    }
    uVar3 = Rand_div((uint)z_info->store_shuffle);
    if (uVar3 == 0) {
      if (((player->opts).opt[0x1a] & 1U) != 0) {
        msg("Shuffling a Shopkeeper...");
      }
      do {
        do {
          uVar3 = Rand_div(world->num_towns);
          ptVar1 = world->towns;
          uVar4 = Rand_div((uint)z_info->store_max);
        } while (uVar4 == store_home_idx);
        for (town = (town *)ptVar1[(int)uVar3].stores;
            (town != (town *)0x0 && (uVar4 != *(uint32_t *)&town->stores)); town = *(town **)town) {
        }
      } while (town == (town *)0x0);
      store_shuffle((store *)town);
    }
  }
  daycount = 0;
  if (((player->opts).opt[0x1a] & 1U) != 0) {
    msg("Done.");
  }
  return;
}

Assistant:

void store_update(void)
{
	if (OPT(player, cheat_xtra)) msg("Updating Shops...");
	while (daycount--) {
		int i;
		struct store *s;

		/* Maintain each shop (except home) */
		for (i = 0; i < world->num_towns; i++) {
			struct town *town = &world->towns[i];
			for (s = town->stores; s; s = s->next) {
				/* Skip the home */
				if (store_is_home(s)) continue;

				/* Maintain */
				store_maint(s);
			}
		}

		/* Sometimes, shuffle the shop-keepers */
		if (one_in_(z_info->store_shuffle)) {
			/* Message */
			if (OPT(player, cheat_xtra)) msg("Shuffling a Shopkeeper...");

			/* Pick a random shop in a random town */
			while (1) {
				int m = randint0(world->num_towns);
				struct town *town = &world->towns[m];
				unsigned int n = randint0(z_info->store_max);
				if (n == store_home_idx) continue;
				for (s = town->stores; s; s = s->next) {
					if (n == s->sidx) break;
				}
				if (s) break;
			}

			/* Shuffle it */
			store_shuffle(s);
		}
	}
	daycount = 0;
	if (OPT(player, cheat_xtra)) msg("Done.");
}